

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O3

void QCache<QString,_QRegularExpression>::Node::createInPlace
               (Node *n,QString *k,QRegularExpression *o,qsizetype cost)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  Value local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (k->d).d;
  pcVar2 = (k->d).ptr;
  qVar3 = (k->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (n->super_Chain).prev = &n->super_Chain;
  (n->super_Chain).next = &n->super_Chain;
  (n->key).d.d = pDVar1;
  (n->key).d.ptr = pcVar2;
  (n->key).d.size = qVar3;
  (n->value).t = o;
  (n->value).cost = cost;
  local_18.t = (QRegularExpression *)0x0;
  local_18.cost = cost;
  Value::~Value(&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void createInPlace(Node *n, const Key &k, T *o, qsizetype cost)
        {
            new (n) Node{ Key(k), Value(o, cost) };
        }